

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<PropertyDef>::emplace<PropertyDef_const&>
          (QMovableArrayOps<PropertyDef> *this,qsizetype i,PropertyDef *args)

{
  PropertyDef **ppPVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_1b0;
  PropertyDef tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size == i)
    {
      qVar5 = QArrayDataPointer<PropertyDef>::freeSpaceAtEnd((QArrayDataPointer<PropertyDef> *)this)
      ;
      if (qVar5 == 0) goto LAB_001235ac;
      PropertyDef::PropertyDef
                ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                 ptr + (this->super_QGenericArrayOps<PropertyDef>).
                       super_QArrayDataPointer<PropertyDef>.size,args);
LAB_001236b3:
      pqVar2 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00123665;
    }
LAB_001235ac:
    if (i == 0) {
      qVar5 = QArrayDataPointer<PropertyDef>::freeSpaceAtBegin
                        ((QArrayDataPointer<PropertyDef> *)this);
      if (qVar5 != 0) {
        PropertyDef::PropertyDef
                  ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                   ptr + -1,args);
        ppPVar1 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.
                   ptr;
        *ppPVar1 = *ppPVar1 + -1;
        goto LAB_001236b3;
      }
    }
  }
  memset(&tmp,0xaa,0x158);
  PropertyDef::PropertyDef(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size != 0
  ;
  QArrayDataPointer<PropertyDef>::detachAndGrow
            ((QArrayDataPointer<PropertyDef> *)this,(uint)(i == 0 && bVar6),1,(PropertyDef **)0x0,
             (QArrayDataPointer<PropertyDef> *)0x0);
  if (i == 0 && bVar6) {
    PropertyDef::PropertyDef
              ((this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.ptr
               + -1,&tmp);
    ppPVar1 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.ptr;
    *ppPVar1 = *ppPVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<PropertyDef>).super_QArrayDataPointer<PropertyDef>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_1b0,(QArrayDataPointer<PropertyDef> *)this,i,1);
    PropertyDef::PropertyDef(local_1b0.displaceFrom,&tmp);
    local_1b0.displaceFrom = local_1b0.displaceFrom + 1;
    (local_1b0.data)->size = (local_1b0.data)->size + local_1b0.nInserts;
  }
  PropertyDef::~PropertyDef(&tmp);
LAB_00123665:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }